

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_shi(DisasContext_conflict14 *ctx,TCGv_i32 ret,TCGv_i32 r1,int32_t shift_count)

{
  TCGContext_conflict9 *tcg_ctx_00;
  TCGContext_conflict9 *tcg_ctx;
  int32_t shift_count_local;
  TCGv_i32 r1_local;
  TCGv_i32 ret_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (shift_count == -0x20) {
    tcg_gen_movi_i32(tcg_ctx_00,ret,0);
  }
  else if (shift_count < 0) {
    tcg_gen_shri_i32_tricore(tcg_ctx_00,ret,r1,-shift_count);
  }
  else {
    tcg_gen_shli_i32_tricore(tcg_ctx_00,ret,r1,shift_count);
  }
  return;
}

Assistant:

static void gen_shi(DisasContext *ctx, TCGv ret, TCGv r1, int32_t shift_count)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    if (shift_count == -32) {
        tcg_gen_movi_tl(tcg_ctx, ret, 0);
    } else if (shift_count >= 0) {
        tcg_gen_shli_tl(tcg_ctx, ret, r1, shift_count);
    } else {
        tcg_gen_shri_tl(tcg_ctx, ret, r1, -shift_count);
    }
}